

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::computeFtest(SPxSolverBase<double> *this)

{
  int iVar1;
  SPxOut *pSVar2;
  ostream *poVar3;
  undefined8 uVar4;
  double dVar5;
  char cVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  double dVar12;
  Verbosity old_verbosity;
  Verbosity local_50 [2];
  undefined1 local_48 [16];
  
  dVar5 = entertol(this);
  this->m_pricingViolUpToDate = true;
  this->m_pricingViolCoUpToDate = true;
  this->m_pricingViol = 0.0;
  this->m_pricingViolCo = 0.0;
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  iVar1 = (this->thecovectors->set).thenum;
  iVar8 = (int)((double)iVar1 * this->sparsePricingFactor);
  if (0 < iVar1) {
    uVar10 = SUB84(dVar5,0);
    uVar11 = (undefined4)((ulong)-dVar5 >> 0x20);
    lVar9 = 0;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = -dVar5;
    local_48._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    do {
      dVar5 = (this->theFvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar9];
      dVar12 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9];
      if (dVar5 <= dVar12) {
        dVar12 = dVar5 - (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar9];
      }
      else {
        dVar12 = dVar12 - dVar5;
      }
      (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9] = dVar12;
      if (this->remainingRoundsLeave == 0) {
        if ((double)CONCAT44(uVar11,uVar10) < dVar12 || (double)CONCAT44(uVar11,uVar10) == dVar12) {
          (this->isInfeasible).data[lVar9] = 0;
        }
        else {
          this->m_pricingViol = this->m_pricingViol - dVar12;
          DIdxSet::addIdx(&this->infeasibilities,(int)lVar9);
          (this->isInfeasible).data[lVar9] = 1;
          this->m_numViol = this->m_numViol + 1;
          uVar10 = local_48._0_4_;
          uVar11 = local_48._4_4_;
        }
        if (iVar8 < (this->infeasibilities).super_IdxSet.num) {
          pSVar2 = this->spxout;
          if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
            local_50[1] = 4;
            local_50[0] = pSVar2->m_verbosity;
            (*pSVar2->_vptr_SPxOut[2])(pSVar2,local_50 + 1);
            pSVar2 = this->spxout;
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar2->m_streams[pSVar2->m_verbosity]," --- using dense pricing",0x18);
            cVar6 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) + cVar6
                           );
            std::ostream::put(cVar6);
            std::ostream::flush();
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_50);
            uVar10 = local_48._0_4_;
            uVar11 = local_48._4_4_;
          }
          this->remainingRoundsLeave = 5;
          this->sparsePricingLeave = false;
          (this->infeasibilities).super_IdxSet.num = 0;
        }
      }
      else if (dVar12 <= (double)CONCAT44(uVar11,uVar10) &&
               (double)CONCAT44(uVar11,uVar10) != dVar12) {
        this->m_pricingViol = this->m_pricingViol - dVar12;
        this->m_numViol = this->m_numViol + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->thecovectors->set).thenum);
  }
  iVar1 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar1 == 0) && (this->sparsePricingLeave == false)) {
    this->remainingRoundsLeave = this->remainingRoundsLeave + -1;
  }
  else if ((iVar1 <= iVar8) && (this->sparsePricingLeave == false)) {
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (local_50[0] = pSVar2->m_verbosity, 3 < (int)local_50[0])) {
      local_50[1] = 4;
      (*pSVar2->_vptr_SPxOut[2])();
      poVar3 = this->spxout->m_streams[this->spxout->m_verbosity];
      uVar4 = *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8);
      if (this->hyperPricingLeave == true) {
        pcVar7 = " --- using hypersparse pricing, ";
        lVar9 = 0x20;
      }
      else {
        pcVar7 = " --- using sparse pricing, ";
        lVar9 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar9);
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity],"sparsity: ",10);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar9 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x10) = 6;
      *(uint *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar9 + -0x18) + 8) = 4;
      std::ostream::_M_insert<double>
                ((double)this->m_numViol / (double)(this->thecovectors->set).thenum);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar9 = *(long *)poVar3;
      *(uint *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar3 + *(long *)(lVar9 + -0x18) + 8) = (long)(int)uVar4;
      std::ios::widen((char)*(undefined8 *)(lVar9 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_50);
    }
    this->sparsePricingLeave = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFtest()
{

   assert(type() == LEAVE);

   R theeps = entertol();
   m_pricingViolUpToDate = true;
   m_pricingViolCoUpToDate = true;
   m_pricingViol = 0;
   m_pricingViolCo = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());

   for(int i = 0; i < dim(); ++i)
   {
      theCoTest[i] = ((*theFvec)[i] > theUBbound[i])
                     ? theUBbound[i] - (*theFvec)[i]
                     : (*theFvec)[i] - theLBbound[i];

      if(remainingRoundsLeave == 0)
      {
         if(theCoTest[i] < -theeps)
         {
            m_pricingViol -= theCoTest[i];
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
            ++m_numViol;
         }
         else
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

         if(infeasibilities.size() > sparsitythreshold)
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                          << std::endl;)
            remainingRoundsLeave = SOPLEX_DENSEROUNDS;
            sparsePricingLeave = false;
            infeasibilities.clear();
         }
      }
      else if(theCoTest[i] < -theeps)
      {
         m_pricingViol -= theCoTest[i];
         m_numViol++;
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingLeave)
   {
      --remainingRoundsLeave;
   }
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingLeave)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingLeave)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) m_numViol / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingLeave = true;
   }
}